

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_hal.cpp
# Opt level: O0

MPP_RET mpp_enc_hal_start(void *hal,HalEncTask *task)

{
  MppEncHalImpl *p;
  HalEncTask *task_local;
  void *hal_local;
  
  if ((hal == (void *)0x0) || (task == (HalEncTask *)0x0)) {
    _mpp_log_l(2,"mpp_enc_hal","found NULL input ctx %p task %p\n","mpp_enc_hal_start",hal,task);
    hal_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else if ((*(long *)((long)hal + 0x10) == 0) ||
          (*(long *)(*(long *)((long)hal + 0x10) + 0x40) == 0)) {
    hal_local._4_4_ = MPP_OK;
  }
  else {
    mpp_buffer_sync_partial_end_f(task->output,0,0,task->length,"mpp_enc_hal_start");
    hal_local._4_4_ =
         (**(code **)(*(long *)((long)hal + 0x10) + 0x40))(*(undefined8 *)((long)hal + 8),task);
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_hal_start(void *hal, HalEncTask *task)
{
    if (NULL == hal || NULL == task) {
        mpp_err_f("found NULL input ctx %p task %p\n", hal, task);
        return MPP_ERR_NULL_PTR;
    }

    MppEncHalImpl *p = (MppEncHalImpl*)hal;
    if (!p->api || !p->api->start)
        return MPP_OK;

    /* Add buffer sync process */
    mpp_buffer_sync_partial_end(task->output, 0, task->length);

    return p->api->start(p->ctx, task);
}